

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Hint.c
# Opt level: O1

int Llb_ManMaxFanoutCi(Aig_Man_t *pAig)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar3 = (ulong)pAig->vCis->nSize;
  if ((long)uVar3 < 1) {
    iVar1 = -1;
  }
  else {
    uVar2 = 0xffffffff;
    uVar6 = 0;
    uVar4 = 0xc4653600;
    do {
      uVar7 = *(uint *)((long)pAig->vCis->pArray[uVar6] + 0x18) >> 6;
      uVar5 = uVar4;
      if ((int)uVar4 <= (int)uVar7) {
        uVar5 = uVar7;
      }
      if ((int)uVar4 < (int)uVar7) {
        uVar2 = uVar6 & 0xffffffff;
      }
      iVar1 = (int)uVar2;
      uVar6 = uVar6 + 1;
      uVar4 = uVar5;
    } while (uVar3 != uVar6);
  }
  if (iVar1 < 0) {
    __assert_fail("iInput >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Hint.c"
                  ,0x37,"int Llb_ManMaxFanoutCi(Aig_Man_t *)");
  }
  return iVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Returns CI index with the largest number of fanouts.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Llb_ManMaxFanoutCi( Aig_Man_t * pAig )
{
    Aig_Obj_t * pObj; 
    int i, WeightMax = -ABC_INFINITY, iInput = -1;
    Aig_ManForEachCi( pAig, pObj, i )
        if ( WeightMax < Aig_ObjRefs(pObj) )
        {
            WeightMax = Aig_ObjRefs(pObj);
            iInput = i;
        }
    assert( iInput >= 0 );
    return iInput;
}